

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# beagle.cpp
# Opt level: O0

int rankResourceImplementationPairs
              (long preferenceFlags,long requirementFlags,PairedList *possibleResources,
              RsrcImplList *possibleResourceImplementations)

{
  bool bVar1;
  int iVar2;
  reference ppVar3;
  reference ppBVar4;
  ulong flags2;
  pair<int,_beagle::BeagleImplFactory_*> *in_RCX;
  BeagleImplFactory *this;
  ulong in_RSI;
  long in_RDI;
  pair<int,_beagle::BeagleImplFactory_*> pVar5;
  int totalScore;
  int implementationScore;
  long factoryFlags;
  iterator factory;
  int resourceScore;
  long resourceSupportedFlags;
  long resourceRequiredFlags;
  int resource;
  iterator it;
  _func_bool_pair<int,_std::pair<int,_beagle::BeagleImplFactory_ptr>_>_ptr_pair<int,_std::pair<int,_beagle::BeagleImplFactory_ptr>_>_ptr
  *in_stack_00000628;
  list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *in_stack_00000630;
  pair<int,_beagle::BeagleImplFactory_*> *in_stack_ffffffffffffff58;
  _Self in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff6c;
  _Self local_60;
  _Self local_58;
  int local_4c;
  ulong local_48;
  ulong local_40;
  int local_34;
  _Self local_30;
  _Self local_28;
  pair<int,_beagle::BeagleImplFactory_*> *local_20;
  ulong local_10;
  long local_8;
  
  local_20 = in_RCX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  std::__cxx11::list<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
  sort<bool(*)(std::pair<int,int>const&,std::pair<int,int>const&)>
            (in_stack_00000630,(_func_bool_pair<int,_int>_ptr_pair<int,_int>_ptr *)in_stack_00000628
            );
  local_28._M_node =
       (_List_node_base *)
       std::__cxx11::list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::begin
                 ((list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                  in_stack_ffffffffffffff58);
  while( true ) {
    local_30._M_node =
         (_List_node_base *)
         std::__cxx11::list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::end
                   ((list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                    in_stack_ffffffffffffff58);
    bVar1 = std::operator!=(&local_28,&local_30);
    if (!bVar1) break;
    ppVar3 = std::_List_iterator<std::pair<int,_int>_>::operator*
                       ((_List_iterator<std::pair<int,_int>_> *)0x12019a);
    local_34 = ppVar3->second;
    local_40 = rsrcList->list[local_34].requiredFlags;
    local_48 = rsrcList->list[local_34].supportFlags;
    ppVar3 = std::_List_iterator<std::pair<int,_int>_>::operator*
                       ((_List_iterator<std::pair<int,_int>_> *)0x1201f2);
    local_4c = ppVar3->first;
    local_58._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<beagle::BeagleImplFactory_*,_std::allocator<beagle::BeagleImplFactory_*>_>::begin
                   ((list<beagle::BeagleImplFactory_*,_std::allocator<beagle::BeagleImplFactory_*>_>
                     *)in_stack_ffffffffffffff58);
    while( true ) {
      local_60._M_node =
           (_List_node_base *)
           std::__cxx11::
           list<beagle::BeagleImplFactory_*,_std::allocator<beagle::BeagleImplFactory_*>_>::end
                     ((list<beagle::BeagleImplFactory_*,_std::allocator<beagle::BeagleImplFactory_*>_>
                       *)in_stack_ffffffffffffff58);
      bVar1 = std::operator!=(&local_58,&local_60);
      if (!bVar1) break;
      ppBVar4 = std::_List_iterator<beagle::BeagleImplFactory_*>::operator*
                          ((_List_iterator<beagle::BeagleImplFactory_*> *)0x120242);
      flags2 = (**(code **)(*(long *)*ppBVar4 + 0x10))();
      if ((((long)local_10 <= (long)(local_10 & flags2)) &&
          ((long)local_40 <= (long)(local_40 & flags2))) &&
         ((long)local_10 <= (long)(local_10 & local_48))) {
        scoreFlags(local_8,flags2);
        in_stack_ffffffffffffff58 = local_20;
        std::_List_iterator<beagle::BeagleImplFactory_*>::operator*
                  ((_List_iterator<beagle::BeagleImplFactory_*> *)0x1202cf);
        pVar5 = std::make_pair<int&,beagle::BeagleImplFactory*&>
                          ((int *)in_stack_ffffffffffffff60._M_node,
                           (BeagleImplFactory **)in_stack_ffffffffffffff58);
        this = pVar5.second;
        iVar2 = pVar5.first;
        std::make_pair<int&,std::pair<int,beagle::BeagleImplFactory*>>
                  ((int *)in_stack_ffffffffffffff60._M_node,in_stack_ffffffffffffff58);
        std::__cxx11::
        list<std::pair<int,_std::pair<int,_beagle::BeagleImplFactory_*>_>,_std::allocator<std::pair<int,_std::pair<int,_beagle::BeagleImplFactory_*>_>_>_>
        ::push_back((list<std::pair<int,_std::pair<int,_beagle::BeagleImplFactory_*>_>,_std::allocator<std::pair<int,_std::pair<int,_beagle::BeagleImplFactory_*>_>_>_>
                     *)this,(value_type *)CONCAT44(in_stack_ffffffffffffff6c,iVar2));
      }
      in_stack_ffffffffffffff60 =
           std::_List_iterator<beagle::BeagleImplFactory_*>::operator++(&local_58,0);
    }
    std::_List_iterator<std::pair<int,_int>_>::operator++(&local_28);
  }
  std::__cxx11::
  list<std::pair<int,std::pair<int,beagle::BeagleImplFactory*>>,std::allocator<std::pair<int,std::pair<int,beagle::BeagleImplFactory*>>>>
  ::
  sort<bool(*)(std::pair<int,std::pair<int,beagle::BeagleImplFactory*>>const&,std::pair<int,std::pair<int,beagle::BeagleImplFactory*>>const&)>
            ((list<std::pair<int,_std::pair<int,_beagle::BeagleImplFactory_*>_>,_std::allocator<std::pair<int,_std::pair<int,_beagle::BeagleImplFactory_*>_>_>_>
              *)in_stack_00000630,in_stack_00000628);
  return 0;
}

Assistant:

int rankResourceImplementationPairs(long preferenceFlags,
                                    long requirementFlags,
                                    PairedList* possibleResources,
                                    RsrcImplList* possibleResourceImplementations) {

    possibleResources->sort(compareOnFirst); // Attempt in rank order, lowest score wins

    // Score each resource-implementation pair given preferences

    for(PairedList::iterator it = possibleResources->begin();
        it != possibleResources->end(); ++it) {
        int resource = (*it).second;
        long resourceRequiredFlags = rsrcList->list[resource].requiredFlags;
        long resourceSupportedFlags = rsrcList->list[resource].supportFlags;
        int resourceScore = (*it).first;
#ifdef BEAGLE_DEBUG_FLOW
        fprintf(stderr,"Possible resource: %s (%d)\n",rsrcList->list[resource].name,resourceScore);
#endif

        for (std::list<beagle::BeagleImplFactory*>::iterator factory =
             implFactory->begin(); factory != implFactory->end(); factory++) {
            long factoryFlags = (*factory)->getFlags();
#ifdef BEAGLE_DEBUG_FLOW
            fprintf(stderr,"\tExamining implementation: %s\n",(*factory)->getName());
#endif
            if ( ((requirementFlags & factoryFlags) >= requirementFlags) // Factory meets requirementFlags
                && ((resourceRequiredFlags & factoryFlags) >= resourceRequiredFlags) // Factory meets resourceFlags
                && ((requirementFlags & resourceSupportedFlags) >= requirementFlags) // Resource meets requirementFlags
                ) {
                int implementationScore = scoreFlags(preferenceFlags,factoryFlags);
                int totalScore = resourceScore + implementationScore;
#ifdef BEAGLE_DEBUG_FLOW
                fprintf(stderr,"\tPossible implementation: %s (%d)\n",
                        (*factory)->getName(),totalScore);
#endif

                possibleResourceImplementations->push_back(std::make_pair(totalScore, std::make_pair(resource, (*factory))));

            }
        }
    }

#ifdef BEAGLE_DEBUG_FLOW
    fprintf(stderr,"\nOriginal list of possible implementations:\n");
    for (RsrcImplList::iterator it = possibleResourceImplementations->begin();
            it != possibleResourceImplementations->end(); ++it) {
        beagle::BeagleImplFactory* factory = (*it).second.second;
        fprintf(stderr,"\t %s (%d)\n", factory->getName(), (*it).first);
    }
#endif

    possibleResourceImplementations->sort(compareRsrcImpl);

#ifdef BEAGLE_DEBUG_FLOW
    fprintf(stderr,"\nSorted list of possible implementations:\n");
    for (RsrcImplList::iterator it = possibleResourceImplementations->begin();
            it != possibleResourceImplementations->end(); ++it) {
        beagle::BeagleImplFactory* factory = (*it).second.second;
        fprintf(stderr,"\t %s (%d)  (%d)\n", factory->getName(), (*it).first, (*it).second.first);
    }
#endif


    return BEAGLE_SUCCESS;
}